

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_barrier.cpp
# Opt level: O0

bool __kmp_linear_barrier_gather_template<true>
               (barrier_type bt,kmp_info_t *this_thr,int gtid,int tid,
               _func_void_void_ptr_void_ptr *reduce,void *itt_sync_obj)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long *plVar5;
  int in_ECX;
  long in_RSI;
  uint in_EDI;
  code *in_R8;
  bool cancelled;
  kmp_flag_64 flag_1;
  kmp_uint64 new_state;
  int i;
  int nproc;
  kmp_balign_team_t *team_bar;
  kmp_flag_64 flag;
  kmp_info_t **other_threads;
  kmp_bstate_t *thr_bar;
  kmp_team_t *team;
  kmp_uint64 *in_stack_ffffffffffffff38;
  kmp_flag_64 *in_stack_ffffffffffffff40;
  void *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  kmp_info_t *in_stack_ffffffffffffff58;
  kmp_flag_64 *in_stack_ffffffffffffff60;
  int local_78;
  
  lVar2 = *(long *)(in_RSI + 0x40);
  lVar3 = *(long *)(lVar2 + 0x340);
  if ((__kmp_forkjoin_frames_mode == 3) || (__kmp_forkjoin_frames_mode == 2)) {
    if (__kmp_itt_get_timestamp_ptr__3_0 == (__kmp_itt_get_timestamp_t *)0x0) {
      in_stack_ffffffffffffff48 = (void *)0x0;
    }
    else {
      in_stack_ffffffffffffff48 = (void *)(*__kmp_itt_get_timestamp_ptr__3_0)();
    }
    *(void **)(in_RSI + 0x100) = in_stack_ffffffffffffff48;
    *(void **)(in_RSI + 0xf8) = in_stack_ffffffffffffff48;
  }
  if (in_ECX == 0) {
    plVar5 = (long *)(lVar2 + 0x40 + (ulong)in_EDI * 0x40);
    iVar1 = *(int *)(in_RSI + 100);
    lVar2 = *plVar5;
    for (local_78 = 1; local_78 < iVar1; local_78 = local_78 + 1) {
      kmp_flag_64::kmp_flag_64(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x17c3f0);
      bVar4 = kmp_flag_64::wait_cancellable_nosleep
                        (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff54 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffff54);
      if (bVar4) {
        return true;
      }
      if (__kmp_forkjoin_frames_mode == 2) {
        if (*(ulong *)(in_RSI + 0x100) < *(ulong *)(*(long *)(lVar3 + (long)local_78 * 8) + 0x100))
        {
          in_stack_ffffffffffffff40 = *(kmp_flag_64 **)(in_RSI + 0x100);
        }
        else {
          in_stack_ffffffffffffff40 =
               *(kmp_flag_64 **)(*(long *)(lVar3 + (long)local_78 * 8) + 0x100);
        }
        *(kmp_flag_64 **)(in_RSI + 0x100) = in_stack_ffffffffffffff40;
      }
      if (in_R8 != (code *)0x0) {
        (*in_R8)(*(undefined8 *)(in_RSI + 0x118),
                 *(undefined8 *)(*(long *)(lVar3 + (long)local_78 * 8) + 0x118));
      }
    }
    *plVar5 = lVar2 + 4;
  }
  else {
    kmp_flag_64::kmp_flag_64
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(kmp_info_t *)0x17c350);
    kmp_flag_64::release((kmp_flag_64 *)0x17c35a);
  }
  return false;
}

Assistant:

static bool __kmp_linear_barrier_gather_template(
    enum barrier_type bt, kmp_info_t *this_thr, int gtid, int tid,
    void (*reduce)(void *, void *) USE_ITT_BUILD_ARG(void *itt_sync_obj)) {
  KMP_TIME_DEVELOPER_PARTITIONED_BLOCK(KMP_linear_gather);
  kmp_team_t *team = this_thr->th.th_team;
  kmp_bstate_t *thr_bar = &this_thr->th.th_bar[bt].bb;
  kmp_info_t **other_threads = team->t.t_threads;

  KA_TRACE(
      20,
      ("__kmp_linear_barrier_gather: T#%d(%d:%d) enter for barrier type %d\n",
       gtid, team->t.t_id, tid, bt));
  KMP_DEBUG_ASSERT(this_thr == other_threads[this_thr->th.th_info.ds.ds_tid]);

#if USE_ITT_BUILD && USE_ITT_NOTIFY
  // Barrier imbalance - save arrive time to the thread
  if (__kmp_forkjoin_frames_mode == 3 || __kmp_forkjoin_frames_mode == 2) {
    this_thr->th.th_bar_arrive_time = this_thr->th.th_bar_min_time =
        __itt_get_timestamp();
  }
#endif
  // We now perform a linear reduction to signal that all of the threads have
  // arrived.
  if (!KMP_MASTER_TID(tid)) {
    KA_TRACE(20,
             ("__kmp_linear_barrier_gather: T#%d(%d:%d) releasing T#%d(%d:%d)"
              "arrived(%p): %llu => %llu\n",
              gtid, team->t.t_id, tid, __kmp_gtid_from_tid(0, team),
              team->t.t_id, 0, &thr_bar->b_arrived, thr_bar->b_arrived,
              thr_bar->b_arrived + KMP_BARRIER_STATE_BUMP));
    // Mark arrival to master thread
    /* After performing this write, a worker thread may not assume that the team
       is valid any more - it could be deallocated by the master thread at any
       time. */
    ANNOTATE_BARRIER_BEGIN(this_thr);
    kmp_flag_64 flag(&thr_bar->b_arrived, other_threads[0]);
    flag.release();
  } else {
    kmp_balign_team_t *team_bar = &team->t.t_bar[bt];
    int nproc = this_thr->th.th_team_nproc;
    int i;
    // Don't have to worry about sleep bit here or atomic since team setting
    kmp_uint64 new_state = team_bar->b_arrived + KMP_BARRIER_STATE_BUMP;

    // Collect all the worker team member threads.
    for (i = 1; i < nproc; ++i) {
#if KMP_CACHE_MANAGE
      // Prefetch next thread's arrived count
      if (i + 1 < nproc)
        KMP_CACHE_PREFETCH(&other_threads[i + 1]->th.th_bar[bt].bb.b_arrived);
#endif /* KMP_CACHE_MANAGE */
      KA_TRACE(20, ("__kmp_linear_barrier_gather: T#%d(%d:%d) wait T#%d(%d:%d) "
                    "arrived(%p) == %llu\n",
                    gtid, team->t.t_id, tid, __kmp_gtid_from_tid(i, team),
                    team->t.t_id, i,
                    &other_threads[i]->th.th_bar[bt].bb.b_arrived, new_state));

      // Wait for worker thread to arrive
      kmp_flag_64 flag(&other_threads[i]->th.th_bar[bt].bb.b_arrived,
                       new_state);
      if (cancellable) {
        bool cancelled = flag.wait_cancellable_nosleep(
            this_thr, FALSE USE_ITT_BUILD_ARG(itt_sync_obj));
        if (cancelled)
          return true;
      } else {
        flag.wait(this_thr, FALSE USE_ITT_BUILD_ARG(itt_sync_obj));
      }
      ANNOTATE_BARRIER_END(other_threads[i]);
#if USE_ITT_BUILD && USE_ITT_NOTIFY
      // Barrier imbalance - write min of the thread time and the other thread
      // time to the thread.
      if (__kmp_forkjoin_frames_mode == 2) {
        this_thr->th.th_bar_min_time = KMP_MIN(
            this_thr->th.th_bar_min_time, other_threads[i]->th.th_bar_min_time);
      }
#endif
      if (reduce) {
        KA_TRACE(100,
                 ("__kmp_linear_barrier_gather: T#%d(%d:%d) += T#%d(%d:%d)\n",
                  gtid, team->t.t_id, tid, __kmp_gtid_from_tid(i, team),
                  team->t.t_id, i));
        ANNOTATE_REDUCE_AFTER(reduce);
        (*reduce)(this_thr->th.th_local.reduce_data,
                  other_threads[i]->th.th_local.reduce_data);
        ANNOTATE_REDUCE_BEFORE(reduce);
        ANNOTATE_REDUCE_BEFORE(&team->t.t_bar);
      }
    }
    // Don't have to worry about sleep bit here or atomic since team setting
    team_bar->b_arrived = new_state;
    KA_TRACE(20, ("__kmp_linear_barrier_gather: T#%d(%d:%d) set team %d "
                  "arrived(%p) = %llu\n",
                  gtid, team->t.t_id, tid, team->t.t_id, &team_bar->b_arrived,
                  new_state));
  }
  KA_TRACE(
      20,
      ("__kmp_linear_barrier_gather: T#%d(%d:%d) exit for barrier type %d\n",
       gtid, team->t.t_id, tid, bt));
  return false;
}